

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O0

uint ON_Font::Internal_FontCharacteristicsAsUnsigned
               (Weight font_weight,Style font_style,Stretch font_stretch,bool bUnderlined,
               bool bStrikethrough)

{
  uint local_54;
  int local_50;
  uint u;
  int i;
  int count;
  uint a [6] [2];
  bool bStrikethrough_local;
  bool bUnderlined_local;
  Stretch font_stretch_local;
  Style font_style_local;
  Weight font_weight_local;
  
  i = 2;
  count = 1;
  a[0][0] = 10;
  a[0][1] = (uint)font_weight;
  a[1][0] = 4;
  a[1][1] = (uint)font_style;
  a[2][0] = 10;
  a[2][1] = (uint)font_stretch;
  a[3][0] = 2;
  a[3][1] = (uint)bUnderlined;
  a[4][0] = 2;
  a[4][1] = (uint)bStrikethrough;
  local_54 = (uint)bStrikethrough % 2;
  for (local_50 = 4; -1 < local_50; local_50 = local_50 + -1) {
    local_54 = local_54 * (&i)[(long)local_50 * 2] +
               a[(long)local_50 + -1][1] % (uint)(&i)[(long)local_50 * 2];
  }
  return local_54;
}

Assistant:

unsigned int ON_Font::Internal_FontCharacteristicsAsUnsigned(
  ON_Font::Weight font_weight,
  ON_Font::Style font_style,
  ON_Font::Stretch font_stretch,
  bool bUnderlined,
  bool bStrikethrough
  )
{
  unsigned int a[][2]
    = {
      { 2U, 1U }, // insures 0 is not a valid FontCharacteristicsAsUnsigned() value.
      { 10U, static_cast<unsigned int>(font_weight) },
      { 4U, static_cast<unsigned int>(font_style) },
      { 10U, static_cast<unsigned int>(font_stretch) },
      // The static_cast<unsigned int> in b ? 1U : 0U is to work around a CLang compiler bug.
      { 2U, static_cast<unsigned int>(bUnderlined ? 1U : 0U) },
      { 2U, static_cast<unsigned int>(bStrikethrough ? 1U : 0U) }
      // insert new information below this line.
  };

  const int count = (int)(sizeof(a) / sizeof(a[0]));
  int i = count-1;
  unsigned int u = a[i][1] % a[i][0];

  for (i--; i >= 0; i--)
  {
    u = (u * a[i][0]) + (a[i][1] % a[i][0]);
  }

  return u;
}